

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

bool __thiscall
es32cts::RobustBufferAccessBehavior::ImageLoadStoreTest::verifyValidResults
          (ImageLoadStoreTest *this,GLuint texture_id)

{
  ostringstream *poVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  TEST_CASES TVar5;
  int iVar6;
  GLenum err;
  undefined4 extraout_var;
  float *pfVar7;
  pointer pfVar8;
  GLuint i;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  vector<float,_std::allocator<float>_> pixels;
  undefined1 local_1a8 [384];
  Functions *gl;
  
  iVar6 = (*((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar6);
  (*gl->memoryBarrier)(0x20);
  err = (*gl->getError)();
  glu::checkError(err,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                  ,0x414);
  TVar5 = (this->super_TexelFetchTest).super_TexelFetchTest.m_test_case;
  if (TVar5 == R32UI_MIPMAP) {
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels,0x400);
    for (lVar9 = 0; lVar9 != 0x400; lVar9 = lVar9 + 1) {
      pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] = 0.0;
    }
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,1,0x10,0x10,0x8d99,0x1405,
               pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    pfVar8 = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar10 = 0; uVar10 != 0x100; uVar10 = uVar10 + 1) {
      if (uVar10 != (uint)*pfVar8) {
        bVar11 = 0xff < uVar10;
        local_1a8._0_8_ =
             ((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.m_context)->m_testCtx
             ->m_log;
        poVar1 = (ostringstream *)(local_1a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,". Expected value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," at offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        goto LAB_00c93235;
      }
      pfVar8 = pfVar8 + 4;
    }
    bVar11 = true;
LAB_00c93235:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels);
  }
  else {
    bVar11 = true;
    if (TVar5 == RGBA32F) {
      deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
      pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<float,_std::allocator<float>_>::resize(&pixels,0x400);
      pfVar8 = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
        fVar12 = (float)(int)lVar9 * 0.00390625;
        *pfVar8 = fVar12;
        pfVar8[1] = fVar12;
        pfVar8[2] = fVar12;
        pfVar8[3] = fVar12;
        pfVar8 = pfVar8 + 4;
      }
      deqp::RobustBufferAccessBehavior::Texture::GetData
                (gl,texture_id,0,0x10,0x10,0x1908,0x1406,
                 pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
      pfVar7 = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + 3;
      for (uVar10 = 0; uVar10 != 0x100; uVar10 = uVar10 + 1) {
        fVar15 = (float)((uint)uVar10 & 0xf) * 0.0625;
        fVar14 = (float)((uint)(uVar10 >> 4) & 0xfffffff) * 0.0625;
        fVar13 = (float)(int)(uint)uVar10 * 0.00390625;
        fVar12 = pfVar7[-3];
        fVar2 = pfVar7[-2];
        fVar3 = pfVar7[-1];
        fVar4 = *pfVar7;
        if (((((fVar15 != fVar12) || (NAN(fVar15) || NAN(fVar12))) || (fVar14 != fVar2)) ||
            ((NAN(fVar14) || NAN(fVar2) || (fVar13 != fVar3)))) ||
           ((NAN(fVar13) || NAN(fVar3) || ((fVar4 != 1.0 || (NAN(fVar4))))))) {
          bVar11 = 0xff < uVar10;
          local_1a8._0_8_ =
               ((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.m_context)->
               m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"Invalid value: ");
          std::ostream::operator<<(poVar1,fVar12);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,fVar2);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,fVar3);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,fVar4);
          std::operator<<((ostream *)poVar1,". Expected value: ");
          std::ostream::operator<<(poVar1,fVar15);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,fVar14);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,fVar13);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,1.0);
          std::operator<<((ostream *)poVar1,". At offset: ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          goto LAB_00c93243;
        }
        pfVar7 = pfVar7 + 4;
      }
      bVar11 = true;
LAB_00c93243:
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&pixels.super__Vector_base<float,_std::allocator<float>_>);
    }
  }
  return bVar11;
}

Assistant:

bool ImageLoadStoreTest::verifyValidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();
	gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

	bool result = true;

	if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::GetData(gl, texture_id, 0 /* level */, width, height, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = (GLfloat)(i % 16) / 16.0f;
			const GLfloat expected_green = (GLfloat)(i / 16) / 16.0f;
			const GLfloat expected_blue  = (GLfloat)i / 256.0f;
			const GLfloat expected_alpha = 1.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels * n_channels; ++i)
		{
			pixels[i] = 0;
		}

		Texture::GetData(gl, texture_id, 1 /* level */, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = i;
			const GLuint drawn_red	= pixels[i * n_channels];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}